

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

STRING_HANDLE
create_devices_and_modules_path
          (STRING_HANDLE iothub_host_fqdn,STRING_HANDLE device_id,STRING_HANDLE module_id)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char *module_id_char_ptr;
  char *device_id_char_ptr;
  char *iothub_host_fqdn_char_ptr;
  LOGGER_LOG l;
  STRING_HANDLE devices_and_modules_path;
  STRING_HANDLE module_id_local;
  STRING_HANDLE device_id_local;
  STRING_HANDLE iothub_host_fqdn_local;
  
  l = (LOGGER_LOG)STRING_new();
  if ((STRING_HANDLE)l == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"create_devices_and_modules_path",0x95,1,
                "Failed creating devices_and_modules_path (STRING_new failed)");
    }
  }
  else {
    pcVar3 = STRING_c_str(iothub_host_fqdn);
    pcVar4 = STRING_c_str(device_id);
    pcVar5 = STRING_c_str(module_id);
    if (pcVar5 == (char *)0x0) {
      iVar1 = STRING_sprintf((STRING_HANDLE)l,"%s/devices/%s",pcVar3,pcVar4);
      if (iVar1 != 0) {
        STRING_delete((STRING_HANDLE)l);
        l = (LOGGER_LOG)0x0;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"create_devices_and_modules_path",0xac,1,
                    "Failed creating devices_and_modules_path (STRING_sprintf failed)");
        }
      }
    }
    else {
      iVar1 = STRING_sprintf((STRING_HANDLE)l,"%s/devices/%s/modules/%s",pcVar3,pcVar4,pcVar5);
      if (iVar1 != 0) {
        STRING_delete((STRING_HANDLE)l);
        l = (LOGGER_LOG)0x0;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"create_devices_and_modules_path",0xa3,1,
                    "Failed creating devices_and_modules_path (STRING_sprintf failed)");
        }
      }
    }
  }
  return (STRING_HANDLE)l;
}

Assistant:

static STRING_HANDLE create_devices_and_modules_path(STRING_HANDLE iothub_host_fqdn, STRING_HANDLE device_id, STRING_HANDLE module_id)
{
    STRING_HANDLE devices_and_modules_path;

    if ((devices_and_modules_path = STRING_new()) == NULL)
    {
        LogError("Failed creating devices_and_modules_path (STRING_new failed)");
    }
    else
    {
        const char* iothub_host_fqdn_char_ptr = STRING_c_str(iothub_host_fqdn);
        const char* device_id_char_ptr = STRING_c_str(device_id);
        const char* module_id_char_ptr = STRING_c_str(module_id);

        if (module_id_char_ptr != NULL)
        {
            if (STRING_sprintf(devices_and_modules_path, IOTHUB_DEVICES_MODULE_PATH_FMT, iothub_host_fqdn_char_ptr, device_id_char_ptr, module_id_char_ptr) != RESULT_OK)
            {
                STRING_delete(devices_and_modules_path);
                devices_and_modules_path = NULL;
                LogError("Failed creating devices_and_modules_path (STRING_sprintf failed)");
            }
        }
        else
        {
            if (STRING_sprintf(devices_and_modules_path, IOTHUB_DEVICES_PATH_FMT, iothub_host_fqdn_char_ptr, device_id_char_ptr) != RESULT_OK)
            {
                STRING_delete(devices_and_modules_path);
                devices_and_modules_path = NULL;
                LogError("Failed creating devices_and_modules_path (STRING_sprintf failed)");
            }
        }
    }

    return devices_and_modules_path;
}